

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *
deqp::gls::checkAndSpecializeExtensions
          (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
           *__return_storage_ptr__,
          vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *src,
          ContextInfo *ctxInfo)

{
  ulong uVar1;
  RequiredExtension *pRVar2;
  ContextInfo *this;
  bool bVar3;
  byte bVar4;
  RequiredExtension *pRVar5;
  size_type sVar6;
  char *name;
  const_reference pvVar7;
  NotSupportedError *pNVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218 [32];
  ulong local_1f8;
  size_t ndx;
  ostringstream extensionList;
  RequiredExtension local_78;
  ulong local_48;
  size_t alternativeNdx;
  const_reference pvStack_38;
  int supportedAltNdx;
  RequiredExtension *extension;
  size_t extNdx;
  ContextInfo *local_20;
  ContextInfo *ctxInfo_local;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *src_local;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *specialized;
  
  extNdx._7_1_ = 0;
  local_20 = ctxInfo;
  ctxInfo_local = (ContextInfo *)src;
  src_local = __return_storage_ptr__;
  std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::vector
            (__return_storage_ptr__);
  extension = (RequiredExtension *)0x0;
  do {
    pRVar2 = extension;
    pRVar5 = (RequiredExtension *)
             std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
             size((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *
                  )ctxInfo_local);
    if (pRVar5 <= pRVar2) {
      return __return_storage_ptr__;
    }
    pvStack_38 = std::
                 vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
                 operator[]((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                             *)ctxInfo_local,(size_type)extension);
    alternativeNdx._4_4_ = -1;
    for (local_48 = 0; uVar1 = local_48,
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&pvStack_38->alternatives), this = local_20, uVar1 < sVar6;
        local_48 = local_48 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&pvStack_38->alternatives,local_48);
      name = (char *)std::__cxx11::string::c_str();
      bVar3 = glu::ContextInfo::isExtensionSupported(this,name);
      if (bVar3) {
        alternativeNdx._4_4_ = (int)local_48;
        break;
      }
    }
    if (alternativeNdx._4_4_ < 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ndx);
      for (local_1f8 = 0; uVar1 = local_1f8,
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&pvStack_38->alternatives), uVar1 < sVar6; local_1f8 = local_1f8 + 1) {
        std::__cxx11::ostringstream::str();
        bVar4 = std::__cxx11::string::empty();
        std::__cxx11::string::~string(local_218);
        if (((bVar4 ^ 0xff) & 1) != 0) {
          std::operator<<((ostream *)&ndx,", ");
        }
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&pvStack_38->alternatives,local_1f8);
        std::operator<<((ostream *)&ndx,(string *)pvVar7);
      }
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pvStack_38->alternatives);
      if (sVar6 == 1) {
        local_259 = 1;
        pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::ostringstream::str();
        std::operator+(&local_238,"Test requires extension ",&local_258);
        tcu::NotSupportedError::NotSupportedError(pNVar8,&local_238);
        local_259 = 0;
        __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::ostringstream::str();
      std::operator+(&local_280,"Test requires any extension of ",&local_2a0);
      tcu::NotSupportedError::NotSupportedError(pNVar8,&local_280);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&pvStack_38->alternatives,(long)alternativeNdx._4_4_);
    glu::sl::RequiredExtension::RequiredExtension(&local_78,pvVar7,pvStack_38->effectiveStages);
    std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::push_back
              (__return_storage_ptr__,&local_78);
    glu::sl::RequiredExtension::~RequiredExtension(&local_78);
    extension = (RequiredExtension *)
                ((long)&(extension->alternatives).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

static vector<RequiredExtension> checkAndSpecializeExtensions (const vector<RequiredExtension>&	src,
															   const ContextInfo&				ctxInfo)
{
	vector<RequiredExtension>	specialized;

	for (size_t extNdx = 0; extNdx < src.size(); ++extNdx)
	{
		const RequiredExtension&	extension		= src[extNdx];
		int							supportedAltNdx	= -1;

		for (size_t alternativeNdx = 0; alternativeNdx < extension.alternatives.size(); ++alternativeNdx)
		{
			if (ctxInfo.isExtensionSupported(extension.alternatives[alternativeNdx].c_str()))
			{
				supportedAltNdx	= (int)alternativeNdx;
				break;
			}
		}

		if (supportedAltNdx >= 0)
		{
			specialized.push_back(RequiredExtension(extension.alternatives[supportedAltNdx], extension.effectiveStages));
		}
		else
		{
			// no extension(s). Make a nice output
			std::ostringstream extensionList;

			for (size_t ndx = 0; ndx < extension.alternatives.size(); ++ndx)
			{
				if (!extensionList.str().empty())
					extensionList << ", ";
				extensionList << extension.alternatives[ndx];
			}

			if (extension.alternatives.size() == 1)
				throw tcu::NotSupportedError("Test requires extension " + extensionList.str());
			else
				throw tcu::NotSupportedError("Test requires any extension of " + extensionList.str());
		}
	}

	return specialized;
}